

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_transaction_base.cpp
# Opt level: O0

string * cfd::api::TransactionApiBase::AddMultisigSign<cfd::TransactionController>
                   (function<cfd::TransactionController_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *create_controller,string *tx_hex,Txid *txid,uint32_t vout,
                   vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *sign_list,
                   AddressType address_type,Script *witness_script,Script *redeem_script,
                   bool clear_stack)

{
  TransactionController *in_RCX;
  Txid *in_RSI;
  TransactionController *in_RDI;
  undefined4 in_R8D;
  Script *unaff_retaddr;
  int in_stack_00000008;
  undefined4 in_stack_0000000c;
  undefined4 in_stack_00000010;
  AddressType in_stack_00000014;
  Script *in_stack_00000018;
  byte in_stack_00000020;
  undefined7 in_stack_00000021;
  Script *in_stack_00000040;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *in_stack_00000048;
  ScriptBuilder sb;
  Script unlocking_script;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> signature_data;
  Script script;
  TransactionController txc;
  AbstractTransactionController *in_stack_fffffffffffffdb8;
  TransactionController *in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  TransactionController *this;
  Script *in_stack_fffffffffffffe20;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *in_stack_fffffffffffffe28;
  pointer in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe4b;
  uint32_t in_stack_fffffffffffffe4c;
  Txid *in_stack_fffffffffffffe50;
  Script *in_stack_fffffffffffffe58;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *in_stack_fffffffffffffe60;
  ScriptBuilder local_178 [3];
  Script local_108 [2];
  Script local_70;
  byte local_31;
  undefined4 local_24;
  TransactionController *local_20;
  
  local_31 = in_stack_00000020 & 1;
  this = in_RDI;
  local_24 = in_R8D;
  local_20 = in_RCX;
  core::Script::Script(&local_70,in_stack_00000018);
  ValidateAddMultisigSign
            ((string *)CONCAT71(in_stack_00000021,in_stack_00000020),
             (vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)in_stack_00000018,
             in_stack_00000014,(Script *)CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr
            );
  core::Script::~Script((Script *)in_stack_fffffffffffffdc0);
  std::
  function<cfd::TransactionController_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::operator()((function<cfd::TransactionController_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)in_RSI,in_stack_fffffffffffffdd0);
  if (in_stack_00000008 != 1) {
    in_stack_00000018 = (Script *)CONCAT44(in_stack_00000014,in_stack_00000010);
  }
  core::Script::Script(local_108,in_stack_00000018);
  CreateMultisigSignatureData(in_stack_00000048,in_stack_00000040);
  if (in_stack_00000008 == 1) {
    SetP2shMultisigUnlockingScript(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    TransactionController::SetUnlockingScript
              (this,in_RSI,(uint32_t)((ulong)in_stack_00000018 >> 0x20),
               (Script *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    core::Script::~Script((Script *)in_stack_fffffffffffffdc0);
  }
  else {
    SetP2wshMultisigWitnessStack<cfd::TransactionController>
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
               in_stack_fffffffffffffe4c,(bool)in_stack_fffffffffffffe4b,
               (TransactionController *)in_stack_fffffffffffffe40);
    if (in_stack_00000008 == 5) {
      core::ScriptBuilder::ScriptBuilder((ScriptBuilder *)0x54655e);
      core::ScriptUtil::CreateP2wshLockingScript((Script *)&stack0xfffffffffffffe50,local_108);
      core::ScriptBuilder::AppendData(local_178,(Script *)&stack0xfffffffffffffe50);
      core::Script::~Script((Script *)in_stack_fffffffffffffdc0);
      core::ScriptBuilder::Build((Script *)&stack0xfffffffffffffe18,local_178);
      TransactionController::SetUnlockingScript
                (this,in_RSI,(uint32_t)((ulong)in_stack_00000018 >> 0x20),
                 (Script *)CONCAT44(local_24,in_stack_fffffffffffffdc8));
      core::Script::~Script((Script *)local_20);
      core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)0x5465fb);
      in_stack_fffffffffffffdc0 = local_20;
    }
  }
  AbstractTransactionController::GetHex_abi_cxx11_(in_stack_fffffffffffffdb8);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)in_stack_00000018)
  ;
  core::Script::~Script((Script *)in_stack_fffffffffffffdc0);
  TransactionController::~TransactionController(in_stack_fffffffffffffdc0);
  return (string *)in_RDI;
}

Assistant:

std::string TransactionApiBase::AddMultisigSign(
    std::function<T(const std::string&)> create_controller,
    const std::string& tx_hex, const Txid& txid, uint32_t vout,
    const std::vector<SignParameter>& sign_list, AddressType address_type,
    const Script& witness_script, const Script& redeem_script,
    bool clear_stack) {
  ValidateAddMultisigSign(
      tx_hex, sign_list, address_type, witness_script, redeem_script);
  T txc = create_controller(tx_hex);

  // extract pubkeys from redeem script
  // ValidateAddMultiSignRequest ensures that we have one of three correct
  // types.
  Script script = (address_type == AddressType::kP2shAddress) ? redeem_script
                                                              : witness_script;

  std::vector<ByteData> signature_data =
      CreateMultisigSignatureData(sign_list, script);

  // set signatures to target input
  if (address_type == AddressType::kP2shAddress) {
    Script unlocking_script =
        SetP2shMultisigUnlockingScript(signature_data, script);
    txc.SetUnlockingScript(txid, vout, unlocking_script);
  } else {
    SetP2wshMultisigWitnessStack(
        signature_data, script, txid, vout, clear_stack, &txc);

    if (address_type == AddressType::kP2shP2wshAddress) {
      // set p2sh redeem script to unlockking script
      ScriptBuilder sb;
      sb.AppendData(ScriptUtil::CreateP2wshLockingScript(script));
      txc.SetUnlockingScript(txid, vout, sb.Build());
    }
  }

  return txc.GetHex();
}